

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceFormatsTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  ulong uVar1;
  ostringstream *this;
  Vector<unsigned_int,_2> *log;
  VkPhysicalDevice_s *pVVar2;
  pointer pVVar3;
  VkSurfaceKHR VVar4;
  TestStatus *pTVar5;
  bool bVar6;
  qpTestResult qVar7;
  __normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  _Var8;
  long *plVar9;
  VkSurfaceFormatKHR *pVVar10;
  undefined1 *puVar11;
  long lVar12;
  ulong uVar13;
  undefined1 *puVar14;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> outputData;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  NativeObjects native;
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  ResultCollector results;
  InstanceHelper instHelper;
  undefined1 local_490 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  Type local_46c;
  undefined **local_468;
  undefined8 uStack_460;
  undefined *local_458 [3];
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_440;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> local_428;
  uint local_410 [2];
  NativeObjects local_408;
  VkSurfaceKHR local_3e8;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_3e0;
  uint local_3d8 [2];
  VkAllocationCallbacks *pVStack_3d0;
  TestStatus *local_3c8;
  Vector<unsigned_int,_2> *local_3c0;
  ResultCollector local_3b8;
  undefined1 local_368 [16];
  Vector<unsigned_int,_2> local_358;
  VkAllocationCallbacks *pVStack_350;
  ios_base local_2f8 [8];
  ios_base local_2f0 [264];
  undefined1 local_1e8 [32];
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  log = (Vector<unsigned_int,_2> *)context->m_testCtx->m_log;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  tcu::ResultCollector::ResultCollector(&local_3b8,(TestLog *)log,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_368._0_8_ = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_408,context,(Extensions *)local_1e8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_368);
  local_3c8 = __return_storage_ptr__;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,&local_1b8.super_InstanceInterface,
             (VkInstance)local_1e8._24_8_,wsiType,
             local_408.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_408.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_3d8[0] = local_358.m_data[0];
  local_3d8[1] = local_358.m_data[1];
  pVStack_3d0 = pVStack_350;
  local_3e8.m_internal = local_368._0_8_;
  aStack_3e0.m_align = local_368._8_8_;
  local_3c0 = log;
  ::vk::enumeratePhysicalDevices
            (&local_440,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_);
  if (local_440.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_440.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    puVar11 = (undefined1 *)0x0;
    puVar14 = wsi::(anonymous_namespace)::
              validateSurfaceFormats(tcu::ResultCollector&,vk::wsi::Type,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&)
              ::s_androidFormats;
    if (wsiType != TYPE_ANDROID) {
      puVar14 = puVar11;
    }
    local_46c = wsiType;
    do {
      bVar6 = isSupportedByAnyQueue
                        (&local_1b8.super_InstanceInterface,
                         local_440.
                         super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)puVar11],local_3e8);
      if (bVar6) {
        ::vk::wsi::getPhysicalDeviceSurfaceFormats
                  (&local_428,&local_1b8.super_InstanceInterface,
                   local_440.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)puVar11],local_3e8);
        local_368._0_8_ = local_3c0;
        this = (ostringstream *)(local_368 + 8);
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Device ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
        local_490._0_8_ =
             local_428.
             super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_490._8_8_ =
             local_428.
             super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        tcu::Format::operator<<
                  ((ostream *)this,
                   (Array<__gnu_cxx::__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>_>
                    *)local_490);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_368 + 8));
        std::ios_base::~ios_base(local_2f0);
        if (wsiType == TYPE_ANDROID) {
          lVar12 = 0;
          do {
            pVVar3 = local_428.
                     super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            _Var8 = std::
                    __find_if<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR_const*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>,__gnu_cxx::__ops::_Iter_equals_val<vk::VkSurfaceFormatKHR_const>>
                              (local_428.
                               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_428.
                               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (VkSurfaceFormatKHR *)(puVar14 + lVar12));
            if (_Var8._M_current == pVVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
              ::vk::operator<<((ostream *)local_368,(VkSurfaceFormatKHR *)(puVar14 + lVar12));
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
              std::ios_base::~ios_base(local_2f8);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_468);
              local_490._0_8_ = local_490 + 0x10;
              pVVar10 = (VkSurfaceFormatKHR *)(plVar9 + 2);
              if ((VkSurfaceFormatKHR *)*plVar9 == pVVar10) {
                local_480._M_allocated_capacity = (size_type)*pVVar10;
                local_480._8_8_ = plVar9[3];
              }
              else {
                local_480._M_allocated_capacity = (size_type)*pVVar10;
                local_490._0_8_ = (VkSurfaceFormatKHR *)*plVar9;
              }
              local_490._8_8_ = plVar9[1];
              *plVar9 = (long)pVVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              tcu::ResultCollector::fail(&local_3b8,(string *)local_490);
              if ((VkSurfaceFormatKHR *)local_490._0_8_ != (VkSurfaceFormatKHR *)(local_490 + 0x10))
              {
                operator_delete((void *)local_490._0_8_,local_480._M_allocated_capacity + 1);
              }
              if (local_468 != local_458) {
                operator_delete(local_468,(ulong)(local_458[0] + 1));
              }
            }
            lVar12 = lVar12 + 8;
          } while (lVar12 != 0x18);
        }
        VVar4.m_internal = local_3e8.m_internal;
        uStack_460 = 0;
        local_468 = &PTR__CheckIncompleteResult_00d62998;
        if ((long)local_428.
                  super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_428.
                  super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          uVar13 = (long)local_428.
                         super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_428.
                         super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          pVVar2 = local_440.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)puVar11];
          std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::vector
                    ((vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *)
                     local_490,uVar13,(allocator_type *)local_368);
          if ((ulong)local_490._0_8_ < (ulong)local_490._8_8_) {
            pVVar10 = (VkSurfaceFormatKHR *)(local_490._0_8_ + 8);
            if ((VkSurfaceFormatKHR *)(local_490._0_8_ + 8) < (ulong)local_490._8_8_) {
              pVVar10 = (VkSurfaceFormatKHR *)local_490._8_8_;
            }
            memset((void *)local_490._0_8_,0xde,
                   ((long)&pVVar10->format + ~local_490._0_8_ & 0xfffffffffffffff8U) + 8);
          }
          uVar13 = uVar13 / 3;
          uStack_460 = uVar13 & 0xffffffff;
          (*(code *)local_468[2])(&local_468,&local_1b8,pVVar2,VVar4.m_internal,local_490._0_8_);
          if (((int)uStack_460 == (int)uVar13) && (uStack_460._4_4_ == 5)) {
            for (pVVar10 = (VkSurfaceFormatKHR *)(local_490._0_8_ + (uStack_460 & 0xffffffff) * 8);
                (pVVar10 < (ulong)local_490._8_8_ &&
                ((char)pVVar10->format ==
                 (VK_FORMAT_D16_UNORM_S8_UINT|VK_FORMAT_R16G16B16A16_SSCALED)));
                pVVar10 = pVVar10 + 1) {
              uVar13 = 0xffffffffffffffff;
              do {
                if (uVar13 == 6) goto LAB_0075b937;
                uVar1 = uVar13 + 1;
                lVar12 = uVar13 + 2;
                uVar13 = uVar1;
              } while (*(char *)((long)&pVVar10->format + lVar12) == -0x22);
              if (uVar1 < 7) break;
LAB_0075b937:
            }
            if (pVVar10 < (ulong)local_490._8_8_) goto LAB_0075b946;
          }
          else {
LAB_0075b946:
            local_368._0_8_ = &local_358;
            local_410[0] = 0x21;
            local_410[1] = 0;
            local_368._0_8_ = std::__cxx11::string::_M_create((ulong *)local_368,(ulong)local_410);
            local_358.m_data[0] = local_410[0];
            local_358.m_data[1] = local_410[1];
            *(undefined8 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 0x10))->m_data =
                 0x495f4b56206e7275;
            *(undefined8 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 0x18))->m_data =
                 0x54454c504d4f434e;
            *(undefined8 *)((Vector<unsigned_int,_2> *)local_368._0_8_)->m_data = 0x6964207972657551
            ;
            *(undefined8 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 8))->m_data =
                 0x7465722074276e64;
            *(undefined1 *)((Vector<unsigned_int,_2> *)(local_368._0_8_ + 0x20))->m_data = 0x45;
            local_368._8_4_ = local_410[0];
            local_368._12_4_ = local_410[1];
            *(VkInstance_s *)
             ((long)((Vector<unsigned_int,_2> *)local_368._0_8_)->m_data + (long)local_410) =
                 (VkInstance_s)0x0;
            tcu::ResultCollector::fail(&local_3b8,(string *)local_368);
            if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
            }
          }
          if ((VkSurfaceFormatKHR *)local_490._0_8_ != (VkSurfaceFormatKHR *)0x0) {
            operator_delete((void *)local_490._0_8_,
                            local_480._M_allocated_capacity - local_490._0_8_);
          }
        }
        wsiType = local_46c;
        if (local_428.
            super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
            _M_impl.super__Vector_impl_data._M_start != (VkSurfaceFormatKHR *)0x0) {
          operator_delete(local_428.
                          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_428.
                                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_428.
                                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          wsiType = local_46c;
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 < (undefined1 *)
                       ((long)local_440.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_440.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  qVar7 = tcu::ResultCollector::getResult(&local_3b8);
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,local_3b8.m_message._M_dataplus._M_p,
             local_3b8.m_message._M_dataplus._M_p + local_3b8.m_message._M_string_length);
  pTVar5 = local_3c8;
  local_3c8->m_code = qVar7;
  (local_3c8->m_description)._M_dataplus._M_p = (pointer)&(local_3c8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8->m_description,local_368._0_8_,local_368._8_8_ + local_368._0_8_);
  if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
  }
  if (local_440.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_440.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((Vector<unsigned_int,_2> *)local_3e8.m_internal != (Vector<unsigned_int,_2> *)0x0) {
    (**(code **)(*(long *)aStack_3e0 + 0x68))
              (aStack_3e0.m_align,local_3d8,local_3e8.m_internal,pVStack_3d0);
  }
  if (local_408.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
      m_data.ptr != (Window *)0x0) {
    (*(local_408.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
       m_data.ptr)->_vptr_Window[1])();
    local_408.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
    ptr = (Window *)0x0;
  }
  if (local_408.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
      m_data.ptr != (Display *)0x0) {
    (*(local_408.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
       m_data.ptr)->_vptr_Display[1])();
    local_408.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
    m_data.ptr = (Display *)0x0;
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if ((VkInstance)local_1e8._24_8_ != (VkInstance)0x0) {
    (*p_Stack_1c8)((VkInstance)local_1e8._24_8_,local_1c0);
  }
  local_1e8._24_8_ = 0;
  p_Stack_1c8 = (DestroyInstanceFunc)0x0;
  local_1c0 = (VkAllocationCallbacks *)0x0;
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
    operator_delete(local_3b8.m_message._M_dataplus._M_p,
                    local_3b8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_prefix._M_dataplus._M_p != &local_3b8.m_prefix.field_2) {
    operator_delete(local_3b8.m_prefix._M_dataplus._M_p,
                    local_3b8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus querySurfaceFormatsTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);
	const NativeObjects				native			(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
		{
			const vector<VkSurfaceFormatKHR>	formats	= getPhysicalDeviceSurfaceFormats(instHelper.vki,
																						  physicalDevices[deviceNdx],
																						  *surface);

			log << TestLog::Message << "Device " << deviceNdx << ": " << tcu::formatArray(formats.begin(), formats.end()) << TestLog::EndMessage;

			validateSurfaceFormats(results, wsiType, formats);
			CheckPhysicalDeviceSurfaceFormatsIncompleteResult()(results, instHelper.vki, physicalDevices[deviceNdx], *surface, formats.size());
		}
		// else skip query as surface is not supported by the device
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}